

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboCompletenessTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles3::Functional::NumSamplesParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,NumSamplesParams *this,NumSamplesParams *params)

{
  bool bVar1;
  ostream *this_00;
  int *local_1a0;
  GLsizei *ns;
  undefined1 local_190 [7];
  bool first;
  ostringstream os;
  NumSamplesParams *params_local;
  
  os._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  bVar1 = true;
  for (local_1a0 = (int *)os._368_8_; local_1a0 != (int *)(os._368_8_ + 0xc);
      local_1a0 = local_1a0 + 1) {
    if (bVar1) {
      bVar1 = false;
    }
    else {
      std::operator<<((ostream *)local_190,"_");
    }
    if (*local_1a0 == -2) {
      std::operator<<((ostream *)local_190,"none");
    }
    else if (*local_1a0 == -1) {
      std::operator<<((ostream *)local_190,"tex");
    }
    else {
      this_00 = std::operator<<((ostream *)local_190,"rbo");
      std::ostream::operator<<(this_00,*local_1a0);
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

string NumSamplesParams::getName (const NumSamplesParams& params)
{
	ostringstream os;
	bool first = true;
	for (const GLsizei* ns	=	DE_ARRAY_BEGIN(params.numSamples);
		 ns					!=	DE_ARRAY_END(params.numSamples);
		 ns++)
	{
		if (first)
			first = false;
		else
			os << "_";

		if (*ns == SAMPLES_NONE)
			os << "none";
		else if (*ns == SAMPLES_TEXTURE)
			os << "tex";
		else
			os << "rbo" << *ns;
	}
	return os.str();
}